

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::SourceCodeInfo_Location::ByteSize(SourceCodeInfo_Location *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint value;
  long lVar8;
  
  uVar7 = this->_has_bits_[0];
  uVar6 = 0;
  iVar3 = 0;
  if ((uVar7 & 0x3fc) != 0) {
    iVar3 = 0;
    if ((uVar7 & 4) != 0) {
      psVar1 = this->leading_comments_;
      value = (uint)psVar1->_M_string_length;
      iVar3 = 1;
      if (0x7f < value) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(value);
        value = (uint)psVar1->_M_string_length;
        uVar7 = this->_has_bits_[0];
      }
      iVar3 = value + iVar3 + 1;
    }
    if ((uVar7 & 8) != 0) {
      psVar1 = this->trailing_comments_;
      uVar7 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        uVar7 = (uint)psVar1->_M_string_length;
      }
      iVar3 = iVar3 + uVar7 + iVar4 + 1;
    }
  }
  iVar4 = (this->path_).current_size_;
  if (0 < iVar4) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      uVar7 = (this->path_).elements_[lVar8];
      if ((int)uVar7 < 0) {
        iVar5 = 10;
      }
      else {
        iVar5 = 1;
        if (0x7f < uVar7) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
          iVar4 = (this->path_).current_size_;
        }
      }
      uVar6 = uVar6 + iVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
    if (0 < (int)uVar6) {
      iVar4 = 2;
      if (0x7f < uVar6) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar4 + iVar3;
    }
  }
  this->_path_cached_byte_size_ = uVar6;
  iVar3 = iVar3 + uVar6;
  iVar4 = (this->span_).current_size_;
  if (iVar4 < 1) {
    uVar7 = 0;
  }
  else {
    lVar8 = 0;
    uVar7 = 0;
    do {
      uVar6 = (this->span_).elements_[lVar8];
      if ((int)uVar6 < 0) {
        iVar5 = 10;
      }
      else {
        iVar5 = 1;
        if (0x7f < uVar6) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar4 = (this->span_).current_size_;
        }
      }
      uVar7 = uVar7 + iVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
    if (0 < (int)uVar7) {
      iVar4 = 2;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar4 + iVar3;
    }
  }
  this->_span_cached_byte_size_ = uVar7;
  iVar3 = iVar3 + uVar7;
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar4 + iVar3;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int SourceCodeInfo_Location::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  // repeated int32 path = 1 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->path_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->path(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->span_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->span(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}